

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  Value *this_local;
  
  bVar1 = HasNoError(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->mData);
  }
  else {
    Error::ToString_abi_cxx11_(__return_storage_ptr__,&this->mError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::Value::ToString() const
{
    return HasNoError() ? mData : mError.ToString();
}